

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall ON_PlaneSurface::Extend(ON_PlaneSurface *this,int dir,ON_Interval *domain)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  ON_Interval *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_Interval tdom;
  ON_Interval xdom;
  ON_Interval local_68;
  ON_Interval local_58;
  double local_48;
  ON_Interval local_40;
  
  if (1 < (uint)dir) {
    return false;
  }
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
  local_68.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  lVar4 = (ulong)(uint)dir * 0x10;
  this_00 = (ON_Interval *)(&this->field_0xb0 + lVar4);
  local_58.m_t[0] = this_00->m_t[0];
  local_58.m_t[1] = *(double *)(&this->field_0xb8 + lVar4);
  local_68.m_t[1] = in_XMM1_Qa;
  dVar1 = ON_Interval::operator[](domain,0);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
  pdVar3 = ON_Interval::operator[](&local_40,0);
  local_48 = *pdVar3;
  if (dVar1 < local_48) {
    dVar2 = ON_Interval::operator[](domain,0);
    pdVar3 = ON_Interval::operator[](&local_68,0);
    *pdVar3 = dVar2;
    dVar2 = ON_Interval::operator[](domain,0);
    dVar2 = ON_Interval::NormalizedParameterAt((ON_Interval *)(&this->field_0x90 + lVar4),dVar2);
    dVar2 = ON_Interval::ParameterAt(this_00,dVar2);
    pdVar3 = ON_Interval::operator[](&local_58,0);
    *pdVar3 = dVar2;
  }
  dVar2 = ON_Interval::operator[](domain,1);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
            (this,(ulong)(uint)dir);
  pdVar3 = ON_Interval::operator[](&local_40,1);
  if (dVar2 < *pdVar3 || dVar2 == *pdVar3) {
    if (local_48 <= dVar1) {
      return false;
    }
  }
  else {
    dVar1 = ON_Interval::operator[](domain,1);
    pdVar3 = ON_Interval::operator[](&local_68,1);
    *pdVar3 = dVar1;
    dVar1 = ON_Interval::operator[](domain,1);
    dVar1 = ON_Interval::NormalizedParameterAt((ON_Interval *)(&this->field_0x90 + lVar4),dVar1);
    dVar1 = ON_Interval::ParameterAt(this_00,dVar1);
    pdVar3 = ON_Interval::operator[](&local_58,1);
    *pdVar3 = dVar1;
  }
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  *(double *)(&this->field_0x90 + lVar4) = local_68.m_t[0];
  *(double *)((long)(&this->field_0x90 + lVar4) + 8) = local_68.m_t[1];
  this_00->m_t[0] = local_58.m_t[0];
  *(double *)(&this->field_0xb8 + lVar4) = local_58.m_t[1];
  return true;
}

Assistant:

bool ON_PlaneSurface::Extend(
      int dir,
      const ON_Interval& domain
      )
{
  if ( dir < 0 || dir > 1 ) return false;
  bool changed = false;
  ON_Interval tdom = Domain(dir);
  ON_Interval xdom = m_extents[dir];

  if (domain[0] < Domain(dir)[0]){
    changed = true;
    tdom[0] = domain[0];
    xdom[0] = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt(domain[0]));
  }
  if (domain[1] > Domain(dir)[1]){
    changed = true;
    tdom[1] = domain[1];
    xdom[1] = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt(domain[1]));
  }
  if (!changed) return false;
  DestroySurfaceTree();

  m_domain[dir] = tdom;
  m_extents[dir] = xdom;
  return true;
}